

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  undefined3 extraout_var;
  UErrorCode local_10 [2];
  UErrorCode sts;
  
  local_10[0] = U_ZERO_ERROR;
  icu_63::umtx_initOnce(&gLocExtKeyMapInitOnce,initFromResourceBundle,local_10);
  UVar1 = U_FAILURE(local_10[0]);
  return CONCAT31(extraout_var,UVar1 == '\0');
}

Assistant:

static UBool
init() {
    UErrorCode sts = U_ZERO_ERROR;
    umtx_initOnce(gLocExtKeyMapInitOnce, &initFromResourceBundle, sts);
    if (U_FAILURE(sts)) {
        return FALSE;
    }
    return TRUE;
}